

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldriver.cpp
# Opt level: O2

QString * __thiscall
QSqlDriver::sqlStatement
          (QString *__return_storage_ptr__,QSqlDriver *this,StatementType type,QString *tableName,
          QSqlRecord *rec,bool preparedStatement)

{
  qsizetype qVar1;
  undefined1 *puVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  char cVar5;
  bool bVar6;
  QChar QVar7;
  int iVar8;
  QLatin1String *pQVar9;
  QChar *pQVar10;
  QString *pQVar11;
  qsizetype i_1;
  long lVar12;
  qsizetype i;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  undefined1 local_68 [16];
  char *local_58;
  QArrayDataPointer<char16_t> *local_50;
  QExplicitlySharedDataPointer<QSqlFieldPrivate> local_48;
  QArrayDataPointer<char16_t> *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if ((tableName->d).size == 0) {
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
  }
  else {
    prepareIdentifier((QString *)&local_88,tableName,TableName,this);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QString::reserve(__return_storage_ptr__,0x80);
  switch(type) {
  case WhereStatement:
    local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    if ((undefined1 *)local_88.size == (undefined1 *)0x0) {
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
    }
    else {
      local_68._0_8_ = &local_88;
      local_68._8_2_ = 0x2e;
      QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>
                ((QString *)&local_a8,(QStringBuilder<const_QString_&,_char16_t> *)local_68);
    }
    for (lVar12 = 0; iVar8 = QSqlRecord::count(rec), lVar12 < iVar8; lVar12 = lVar12 + 1) {
      iVar8 = (int)lVar12;
      bVar6 = QSqlRecord::isGenerated(rec,iVar8);
      if (bVar6) {
        QString::append((QLatin1String *)__return_storage_ptr__);
        QString::append(__return_storage_ptr__);
        QSqlRecord::fieldName((QString *)&local_c0,rec,iVar8);
        prepareIdentifier((QString *)local_68,(QString *)&local_c0,FieldName,this);
        QString::append(__return_storage_ptr__);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
        bVar6 = QSqlRecord::isNull(rec,iVar8);
        if ((bVar6) || (preparedStatement)) {
          QString::append((QLatin1String *)__return_storage_ptr__);
        }
        else {
          pQVar11 = (QString *)QString::append((QLatin1String *)__return_storage_ptr__);
          QSqlRecord::field((QSqlField *)local_68,rec,iVar8);
          (**(code **)(*(long *)this + 0x98))(&local_c0,this,(QSqlField *)local_68,0);
          QString::append(pQVar11);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
          QSqlField::~QSqlField((QSqlField *)local_68);
        }
      }
    }
    break;
  case SelectStatement:
    for (lVar12 = 0; iVar8 = QSqlRecord::count(rec), lVar12 < iVar8; lVar12 = lVar12 + 1) {
      bVar6 = QSqlRecord::isGenerated(rec,(int)lVar12);
      if (bVar6) {
        QSqlRecord::fieldName((QString *)&local_a8,rec,(int)lVar12);
        prepareIdentifier((QString *)local_68,(QString *)&local_a8,FieldName,this);
        pQVar9 = (QLatin1String *)QString::append(__return_storage_ptr__);
        QString::append(pQVar9);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      }
    }
    if ((__return_storage_ptr__->d).size == 0) goto switchD_0011e1fa_default;
    QString::chop((longlong)__return_storage_ptr__);
    local_68._0_8_ = (QArrayDataPointer<char16_t> *)0x7;
    local_68._8_8_ = "SELECT ";
    local_50 = (QArrayDataPointer<char16_t> *)0x6;
    local_48.d.ptr = (totally_ordered_wrapper<QSqlFieldPrivate_*>)((long)"DELETE FROM " + 6);
    local_40 = &local_88;
    local_58 = (char *)__return_storage_ptr__;
    QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_const_QString_&>
    ::convertTo<QString>
              ((QString *)&local_a8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_const_QString_&>
                *)local_68);
    goto LAB_0011e69f;
  case UpdateStatement:
    local_68._8_8_ = (char *)0x7;
    local_58 = "UPDATE ";
    local_50 = &local_88;
    local_48.d.ptr = (totally_ordered_wrapper<QSqlFieldPrivate_*>)(QSqlFieldPrivate *)0x5;
    local_40 = (QArrayDataPointer<char16_t> *)0x1396eb;
    local_68._0_8_ = __return_storage_ptr__;
    QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&>,_QLatin1String>
    ::convertTo<QString>
              ((QString *)&local_a8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&>,_QLatin1String>
                *)local_68);
    pDVar3 = (__return_storage_ptr__->d).d;
    pcVar4 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_a8.d;
    (__return_storage_ptr__->d).ptr = local_a8.ptr;
    puVar2 = (undefined1 *)(__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_a8.size;
    local_a8.d = pDVar3;
    local_a8.ptr = pcVar4;
    local_a8.size = (qsizetype)puVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    for (lVar12 = 0; iVar8 = QSqlRecord::count(rec), lVar12 < iVar8; lVar12 = lVar12 + 1) {
      iVar8 = (int)lVar12;
      bVar6 = QSqlRecord::isGenerated(rec,iVar8);
      if (bVar6) {
        QSqlRecord::fieldName((QString *)&local_a8,rec,iVar8);
        prepareIdentifier((QString *)local_68,(QString *)&local_a8,FieldName,this);
        QVar7.ucs = QString::append(__return_storage_ptr__);
        QString::append(QVar7);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
        if (preparedStatement) {
          QString::append((QChar)(char16_t)__return_storage_ptr__);
        }
        else {
          QSqlRecord::field((QSqlField *)local_68,rec,iVar8);
          (**(code **)(*(long *)this + 0x98))
                    (&local_a8,this,
                     (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&>,_QLatin1String>
                      *)local_68,0);
          QString::append(__return_storage_ptr__);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
          QSqlField::~QSqlField((QSqlField *)local_68);
        }
        QString::append((QLatin1String *)__return_storage_ptr__);
      }
    }
    cVar5 = QString::endsWith((QLatin1String *)__return_storage_ptr__,2);
    if (cVar5 == '\0') {
      QString::clear(__return_storage_ptr__);
    }
    else {
      QString::chop((longlong)__return_storage_ptr__);
    }
    goto switchD_0011e1fa_default;
  case InsertStatement:
    local_68._8_8_ = (char *)0xc;
    local_58 = "INSERT INTO ";
    local_50 = &local_88;
    local_48.d.ptr = (totally_ordered_wrapper<QSqlFieldPrivate_*>)(QSqlFieldPrivate *)0x2;
    local_40 = (QArrayDataPointer<char16_t> *)0x139711;
    local_68._0_8_ = __return_storage_ptr__;
    QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&>,_QLatin1String>
    ::convertTo<QString>
              ((QString *)&local_a8,
               (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&>,_QLatin1String>
                *)local_68);
    pDVar3 = (__return_storage_ptr__->d).d;
    pcVar4 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_a8.d;
    (__return_storage_ptr__->d).ptr = local_a8.ptr;
    qVar1 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_a8.size;
    local_a8.d = pDVar3;
    local_a8.ptr = pcVar4;
    local_a8.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
    for (lVar12 = 0; iVar8 = QSqlRecord::count(rec), lVar12 < iVar8; lVar12 = lVar12 + 1) {
      iVar8 = (int)lVar12;
      bVar6 = QSqlRecord::isGenerated(rec,iVar8);
      if (bVar6) {
        QSqlRecord::fieldName((QString *)&local_c0,rec,iVar8);
        prepareIdentifier((QString *)local_68,(QString *)&local_c0,FieldName,this);
        pQVar9 = (QLatin1String *)QString::append(__return_storage_ptr__);
        QString::append(pQVar9);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
        if (preparedStatement) {
          QString::append((QChar)(char16_t)&local_a8);
        }
        else {
          QSqlRecord::field((QSqlField *)local_68,rec,iVar8);
          (**(code **)(*(long *)this + 0x98))(&local_c0,this,(QSqlField *)local_68,0);
          QString::append((QString *)&local_a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
          QSqlField::~QSqlField((QSqlField *)local_68);
        }
        QString::append((QLatin1String *)&local_a8);
      }
    }
    if ((undefined1 *)local_a8.size == (undefined1 *)0x0) {
      QString::clear(__return_storage_ptr__);
    }
    else {
      QString::chop((longlong)&local_a8);
      lVar12 = (__return_storage_ptr__->d).size;
      pQVar10 = QString::data(__return_storage_ptr__);
      pQVar10[lVar12 + -2].ucs = L')';
      pQVar11 = (QString *)QString::append((QLatin1String *)__return_storage_ptr__);
      QVar7.ucs = QString::append(pQVar11);
      QString::append(QVar7);
    }
    break;
  case DeleteStatement:
    local_68._8_8_ = (char *)0xc;
    local_58 = "DELETE FROM ";
    local_50 = &local_88;
    local_68._0_8_ = __return_storage_ptr__;
    QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&>::convertTo<QString>
              ((QString *)&local_a8,
               (QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_const_QString_&> *)local_68
              );
LAB_0011e69f:
    pDVar3 = (__return_storage_ptr__->d).d;
    pcVar4 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_a8.d;
    (__return_storage_ptr__->d).ptr = local_a8.ptr;
    puVar2 = (undefined1 *)(__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_a8.size;
    local_a8.d = pDVar3;
    local_a8.ptr = pcVar4;
    local_a8.size = (qsizetype)puVar2;
    break;
  default:
    goto switchD_0011e1fa_default;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
switchD_0011e1fa_default:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlDriver::sqlStatement(StatementType type, const QString &tableName,
                                 const QSqlRecord &rec, bool preparedStatement) const
{
    const auto tableNameString = tableName.isEmpty() ? QString()
                                    : prepareIdentifier(tableName, QSqlDriver::TableName, this);
    QString s;
    s.reserve(128);
    switch (type) {
    case SelectStatement:
        for (qsizetype i = 0; i < rec.count(); ++i) {
            if (rec.isGenerated(i))
                s.append(prepareIdentifier(rec.fieldName(i), QSqlDriver::FieldName, this)).append(", "_L1);
        }
        if (s.isEmpty())
            return s;
        s.chop(2);
        s = "SELECT "_L1 + s + " FROM "_L1 + tableNameString;
        break;
    case WhereStatement:
    {
        const QString tableNamePrefix = tableNameString.isEmpty()
                                            ? QString() : tableNameString + u'.';
        for (qsizetype i = 0; i < rec.count(); ++i) {
            if (!rec.isGenerated(i))
                continue;
            s.append(s.isEmpty() ? "WHERE "_L1 : " AND "_L1);
            s.append(tableNamePrefix);
            s.append(prepareIdentifier(rec.fieldName(i), QSqlDriver::FieldName, this));
            if (rec.isNull(i))
                s.append(" IS NULL"_L1);
            else if (preparedStatement)
                s.append(" = ?"_L1);
            else
                s.append(" = "_L1).append(formatValue(rec.field(i)));
        }
        break;
    }
    case UpdateStatement:
        s = s + "UPDATE "_L1 + tableNameString + " SET "_L1;
        for (qsizetype i = 0; i < rec.count(); ++i) {
            if (!rec.isGenerated(i))
                continue;
            s.append(prepareIdentifier(rec.fieldName(i), QSqlDriver::FieldName, this)).append(u'=');
            if (preparedStatement)
                s.append(u'?');
            else
                s.append(formatValue(rec.field(i)));
            s.append(", "_L1);
        }
        if (s.endsWith(", "_L1))
            s.chop(2);
        else
            s.clear();
        break;
    case DeleteStatement:
        s = s + "DELETE FROM "_L1 + tableNameString;
        break;
    case InsertStatement: {
        s = s + "INSERT INTO "_L1 + tableNameString + " ("_L1;
        QString vals;
        for (qsizetype i = 0; i < rec.count(); ++i) {
            if (!rec.isGenerated(i))
                continue;
            s.append(prepareIdentifier(rec.fieldName(i), QSqlDriver::FieldName, this)).append(", "_L1);
            if (preparedStatement)
                vals.append(u'?');
            else
                vals.append(formatValue(rec.field(i)));
            vals.append(", "_L1);
        }
        if (vals.isEmpty()) {
            s.clear();
        } else {
            vals.chop(2); // remove trailing comma
            s[s.size() - 2] = u')';
            s.append("VALUES ("_L1).append(vals).append(u')');
        }
        break; }
    }
    return s;
}